

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupDfs(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Abc_Cex_t *pAVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar1 = pVVar9->pArray[lVar14];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0067cbc2;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar8 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar8)) {
LAB_0067cbe1:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar8 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar8)) goto LAB_0067cbe1;
      pGVar4[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar5) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = p->vCos;
  uVar12 = (ulong)(uint)pVVar9->nSize;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar11 = (int)uVar12;
      iVar1 = pVVar9->pArray[lVar14];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0067cbc2;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar1;
      Gia_ManDupDfs_rec(p_00,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCos;
      iVar11 = pVVar9->nSize;
      uVar12 = (ulong)iVar11;
    } while (lVar14 < (long)uVar12);
    if (0 < iVar11) {
      lVar14 = 0;
      do {
        iVar1 = pVVar9->pArray[lVar14];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0067cbc2:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar1;
        uVar13 = (uint)*(undefined8 *)pGVar4;
        uVar2 = pGVar4[-(ulong)(uVar13 & 0x1fffffff)].Value;
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar2);
        lVar14 = lVar14 + 1;
        pVVar9 = p->vCos;
      } while (lVar14 < pVVar9->nSize);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar10 = Abc_CexDup(p->pCexSeq,p->nRegs);
    p_00->pCexSeq = pAVar10;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}